

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O3

void __thiscall google::FlagSaver::~FlagSaver(FlagSaver *this)

{
  pointer __ptr;
  
  fLI::FLAGS_v = this->v_;
  fLI::FLAGS_stderrthreshold = this->stderrthreshold_;
  fLB::FLAGS_logtostderr = this->logtostderr_;
  fLB::FLAGS_alsologtostderr = this->alsologtostderr_;
  std::__cxx11::string::_M_assign((string *)&fLS::FLAGS_logmailer_buf_abi_cxx11_);
  __ptr = (this->logmailer_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__ptr != &(this->logmailer_).field_2) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~FlagSaver() {
    FLAGS_v = v_;
    FLAGS_stderrthreshold = stderrthreshold_;
    FLAGS_logtostderr = logtostderr_;
    FLAGS_alsologtostderr = alsologtostderr_;
    FLAGS_logmailer = logmailer_;
  }